

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

void EscapeParam(char *pDst,char *pSrc,int size)

{
  int iVar1;
  long lVar2;
  char cVar3;
  
  cVar3 = *pSrc;
  if (1 < size && cVar3 != '\0') {
    lVar2 = 1;
    do {
      if ((cVar3 == '\\') || (cVar3 == '\"')) {
        *pDst = '\\';
        pDst = pDst + 1;
      }
      *pDst = pSrc[lVar2 + -1];
      pDst = pDst + 1;
      cVar3 = pSrc[lVar2];
    } while ((cVar3 != '\0') && (iVar1 = (int)lVar2, lVar2 = lVar2 + 1, iVar1 < size + -1));
  }
  *pDst = '\0';
  return;
}

Assistant:

void EscapeParam(char *pDst, const char *pSrc, int size)
{
	for(int i = 0; *pSrc && i < size - 1; ++i)
	{
		if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
			*pDst++ = '\\';
		*pDst++ = *pSrc++;
	}
	*pDst = 0;
}